

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::hugeint_t,float,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (hugeint_t *ldata,float *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ValidityMask *pVVar1;
  ValidityMask *pVVar2;
  idx_t i;
  ValidityMask *pVVar3;
  float fVar4;
  hugeint_t input;
  hugeint_t input_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    pVVar2 = result_mask;
    for (pVVar3 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar3;
        pVVar3 = (ValidityMask *)
                 ((long)&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar1 = pVVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        pVVar1 = (ValidityMask *)(ulong)sel_vector->sel_vector[(long)pVVar3];
      }
      input_00.upper = (int64_t)result_mask;
      input_00.lower = ldata[(long)pVVar1].upper;
      fVar4 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<duckdb::hugeint_t,float>
                        ((VectorTryCastOperator<duckdb::NumericTryCast> *)ldata[(long)pVVar1].lower,
                         input_00,pVVar3,(idx_t)dataptr,pVVar2);
      result_data[(long)pVVar3] = fVar4;
    }
  }
  else {
    pVVar2 = result_mask;
    for (pVVar3 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar3;
        pVVar3 = (ValidityMask *)
                 ((long)&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar1 = pVVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        pVVar1 = (ValidityMask *)(ulong)sel_vector->sel_vector[(long)pVVar3];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[(ulong)pVVar1 >> 6] >>
           ((ulong)pVVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,(idx_t)pVVar3);
      }
      else {
        input.upper = (int64_t)result_mask;
        input.lower = ldata[(long)pVVar1].upper;
        fVar4 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<duckdb::hugeint_t,float>
                          ((VectorTryCastOperator<duckdb::NumericTryCast> *)
                           ldata[(long)pVVar1].lower,input,pVVar3,(idx_t)dataptr,pVVar2);
        result_data[(long)pVVar3] = fVar4;
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}